

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O1

void jsonChildren::reserve2(jsonChildren **mine,json_index_t amount)

{
  char *pcVar1;
  json_index_t jVar2;
  jsonChildren *pjVar3;
  JSONNode **ppJVar4;
  uint uVar5;
  size_t count;
  undefined1 auStack_48 [8];
  _Alloc_hider _Stack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_38;
  
  pjVar3 = *mine;
  if (pjVar3->array == (JSONNode **)0x0) {
    auStack_48 = (undefined1  [8])&aStack_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_48,"Children is null reserve","");
    JSONDebug::_JSON_ASSERT(true,(json_string *)auStack_48);
    if (auStack_48 != (undefined1  [8])&aStack_38) {
      operator_delete((void *)auStack_48);
    }
    ppJVar4 = pjVar3->array;
    auStack_48 = (undefined1  [8])&aStack_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_48,"reserve is not meant to expand a preexisting array","");
    JSONDebug::_JSON_ASSERT(ppJVar4 == (JSONNode **)0x0,(json_string *)auStack_48);
    if (auStack_48 != (undefined1  [8])&aStack_38) {
      operator_delete((void *)auStack_48);
    }
    jVar2 = pjVar3->mycapacity;
    auStack_48 = (undefined1  [8])&aStack_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_48,"reservec is not meant to expand a preexisting array","");
    JSONDebug::_JSON_ASSERT(jVar2 == 0,(json_string *)auStack_48);
    if (auStack_48 != (undefined1  [8])&aStack_38) {
      operator_delete((void *)auStack_48);
    }
    jVar2 = pjVar3->mysize;
    auStack_48 = (undefined1  [8])&aStack_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_48,"reserves is not meant to expand a preexisting array","");
    JSONDebug::_JSON_ASSERT(jVar2 == 0,(json_string *)auStack_48);
    if (auStack_48 != (undefined1  [8])&aStack_38) {
      operator_delete((void *)auStack_48);
    }
    pjVar3->mycapacity = amount;
    ppJVar4 = (JSONNode **)malloc((ulong)amount << 3);
    aStack_38._M_allocated_capacity._0_5_ = 0x6f2074754f;
    aStack_38._M_allocated_capacity._5_3_ = 0x6d2066;
    aStack_38._8_5_ = 0x79726f6d65;
    _Stack_40._M_p = (pointer)0xd;
    aStack_38._M_local_buf[0xd] = '\0';
    auStack_48 = (undefined1  [8])&aStack_38;
    JSONDebug::_JSON_ASSERT(ppJVar4 != (JSONNode **)0x0,(json_string *)auStack_48);
    if (auStack_48 != (undefined1  [8])&aStack_38) {
      operator_delete((void *)auStack_48);
    }
    pjVar3->array = ppJVar4;
    return;
  }
  uVar5 = amount - pjVar3->mycapacity;
  if (amount < pjVar3->mycapacity || uVar5 == 0) {
    return;
  }
  pcVar1 = aStack_38._M_local_buf + 8;
  _Stack_40._M_p = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&_Stack_40,"Children is null inc(amount)","");
  JSONDebug::_JSON_ASSERT(true,(json_string *)&_Stack_40);
  if (_Stack_40._M_p != pcVar1) {
    operator_delete(_Stack_40._M_p);
  }
  if ((uVar5 != 0) && (pjVar3->mycapacity <= pjVar3->mysize + uVar5)) {
    if (pjVar3->mycapacity == 0) {
      ppJVar4 = pjVar3->array;
      _Stack_40._M_p = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&_Stack_40,"Expanding a 0 capacity array, but not null","");
      JSONDebug::_JSON_ASSERT(ppJVar4 == (JSONNode **)0x0,(json_string *)&_Stack_40);
      if (_Stack_40._M_p != pcVar1) {
        operator_delete(_Stack_40._M_p);
      }
      count = 8;
      if (8 < uVar5) {
        count = (size_t)uVar5;
      }
      ppJVar4 = json_malloc<JSONNode*>(count);
      pjVar3->array = ppJVar4;
      pjVar3->mycapacity = (json_index_t)count;
    }
    else {
      inc();
    }
  }
  return;
}

Assistant:

void jsonChildren::reserve2(jsonChildren *& mine, json_index_t amount) json_nothrow {
    if (mine -> array != 0){
	   if (mine -> mycapacity < amount){
		  mine -> inc(amount - mine -> mycapacity);
		  #ifdef JSON_LESS_MEMORY
			 mine = jsonChildren_Reserved::newChildren_Reserved(mine, amount);
		  #endif
	   }
    } else {
	   mine -> reserve(amount);
    }
}